

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTest8B_d16_DISABLED_Speed_Test::TestBody
          (BlendA64MaskTest8B_d16_DISABLED_Speed_Test *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  int iVar3;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
  *in_RDI;
  int i_1;
  int i;
  int bsize;
  int kRunTimes;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x16; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < 0x14000; local_14 = local_14 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->dst_ref_[local_14] = uVar1;
      uVar1 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_RDI);
      in_RDI->dst_tst_[local_14] = uVar1;
      uVar2 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_RDI);
      in_RDI->src0_[local_14] = uVar2 & 0x3fff;
      uVar2 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_RDI);
      in_RDI->src1_[local_14] = uVar2 & 0x3fff;
    }
    for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 1) {
      iVar3 = libaom_test::ACMRandom::operator()((ACMRandom *)in_RDI,in_stack_ffffffffffffffdc);
      in_RDI->mask_[local_18] = (uint8_t)iVar3;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, kRunTimes);
  }
}